

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

Const_Proxy_Function __thiscall
chaiscript::bootstrap::Bootstrap::get_guard(Bootstrap *this,Const_Proxy_Function *t_pf)

{
  long lVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *this_02;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  Const_Proxy_Function CVar6;
  
  this_02 = (t_pf->
            super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (this_02 == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    auVar5 = __dynamic_cast(this_02,&dispatch::Proxy_Function_Base::typeinfo,
                            &dispatch::Dynamic_Proxy_Function::typeinfo,0);
    in_RDX._M_pi = auVar5._8_8_;
    lVar3 = auVar5._0_8_;
  }
  if (lVar3 == 0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar3 = 0;
  }
  else {
    this_01 = (t_pf->
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  if (lVar3 == 0) {
    bVar4 = false;
  }
  else {
    lVar1 = *(long *)(lVar3 + 0x48);
    this_02 = *(element_type **)(lVar3 + 0x50);
    if (this_02 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(this_02->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start =
             *(int *)&(this_02->m_types).
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&(this_02->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start =
             *(int *)&(this_02->m_types).
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    bVar4 = lVar1 != 0;
  }
  if (this_02 != (element_type *)0x0 && lVar3 != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
    in_RDX._M_pi = extraout_RDX;
  }
  if (bVar4) {
    uVar2 = *(undefined8 *)(lVar3 + 0x48);
    lVar3 = *(long *)(lVar3 + 0x50);
    if (lVar3 != 0) {
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      }
    }
    *(undefined8 *)this = uVar2;
    *(long *)(this + 8) = lVar3;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      in_RDX._M_pi = extraout_RDX_00;
    }
    CVar6.
    super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_RDX._M_pi;
    CVar6.
    super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Const_Proxy_Function)
           CVar6.
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Function does not have a guard");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Const_Proxy_Function get_guard(const Const_Proxy_Function &t_pf) {
      const auto pf = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_pf);
      if (pf && pf->get_guard()) {
        return pf->get_guard();
      } else {
        throw std::runtime_error("Function does not have a guard");
      }
    }